

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cc
# Opt level: O0

void __thiscall fasttext::Args::dump(Args *this,ostream *out)

{
  ostream *poVar1;
  void *pvVar2;
  ostream *in_RSI;
  long in_RDI;
  string local_60 [4];
  model_name in_stack_ffffffffffffffa4;
  Args *in_stack_ffffffffffffffa8;
  string local_30 [32];
  ostream *local_10;
  
  local_10 = in_RSI;
  poVar1 = std::operator<<(in_RSI,"dim");
  poVar1 = std::operator<<(poVar1," ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,*(int *)(in_RDI + 0x84));
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(local_10,"ws");
  poVar1 = std::operator<<(poVar1," ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,*(int *)(in_RDI + 0x88));
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(local_10,"epoch");
  poVar1 = std::operator<<(poVar1," ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,*(int *)(in_RDI + 0x8c));
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(local_10,"minCount");
  poVar1 = std::operator<<(poVar1," ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,*(int *)(in_RDI + 0x90));
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(local_10,"neg");
  poVar1 = std::operator<<(poVar1," ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,*(int *)(in_RDI + 0x98));
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(local_10,"wordNgrams");
  poVar1 = std::operator<<(poVar1," ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,*(int *)(in_RDI + 0x9c));
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(local_10,"loss");
  poVar1 = std::operator<<(poVar1," ");
  lossToString_abi_cxx11_(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4);
  poVar1 = std::operator<<(poVar1,local_30);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_30);
  poVar1 = std::operator<<(local_10,"model");
  poVar1 = std::operator<<(poVar1," ");
  modelToString_abi_cxx11_(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4);
  poVar1 = std::operator<<(poVar1,local_60);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_60);
  poVar1 = std::operator<<(local_10,"bucket");
  poVar1 = std::operator<<(poVar1," ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,*(int *)(in_RDI + 0xa8));
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(local_10,"minn");
  poVar1 = std::operator<<(poVar1," ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,*(int *)(in_RDI + 0xac));
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(local_10,"maxn");
  poVar1 = std::operator<<(poVar1," ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,*(int *)(in_RDI + 0xb0));
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(local_10,"lrUpdateRate");
  poVar1 = std::operator<<(poVar1," ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,*(int *)(in_RDI + 0x80));
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(local_10,"t");
  poVar1 = std::operator<<(poVar1," ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,*(double *)(in_RDI + 0xb8));
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void Args::dump(std::ostream& out) const {
  out << "dim"
      << " " << dim << std::endl;
  out << "ws"
      << " " << ws << std::endl;
  out << "epoch"
      << " " << epoch << std::endl;
  out << "minCount"
      << " " << minCount << std::endl;
  out << "neg"
      << " " << neg << std::endl;
  out << "wordNgrams"
      << " " << wordNgrams << std::endl;
  out << "loss"
      << " " << lossToString(loss) << std::endl;
  out << "model"
      << " " << modelToString(model) << std::endl;
  out << "bucket"
      << " " << bucket << std::endl;
  out << "minn"
      << " " << minn << std::endl;
  out << "maxn"
      << " " << maxn << std::endl;
  out << "lrUpdateRate"
      << " " << lrUpdateRate << std::endl;
  out << "t"
      << " " << t << std::endl;
}